

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_DH_OBJECT TVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT32_Unmarshal(target,buffer,size);
  if (TVar2 == 0) {
    TVar1 = *target;
    if (TVar1 == 0x40000007) {
      TVar2 = 0x84;
      if (flag != 0) {
        TVar2 = 0;
      }
    }
    else {
      TVar2 = 0x84;
      if (0xfeffffff < TVar1 + 0x7e000000) {
        TVar2 = 0;
      }
      if ((int)TVar1 < -0x7ffffffd) {
        TVar2 = 0;
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
   if (*target == TPM_RH_NULL) {
        if(flag)
            return TPM_RC_SUCCESS;
        else
            return TPM_RC_VALUE;
    }
    if(((*target < TRANSIENT_FIRST) || (*target > TRANSIENT_LAST))
      &&((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST)))
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}